

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

void __thiscall
IMLE<1,_1,_FastLinearExpert>::predictInverseSingle(IMLE<1,_1,_FastLinearExpert> *this,X *x)

{
  Scalar *pSVar1;
  reference pFVar2;
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  *this_00;
  EigenBase<Eigen::Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>_>
  *other;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *this_01;
  value_type_conflict *__x;
  long in_RDI;
  Scal SVar3;
  ZZ invVar;
  int j_1;
  Scal p_x;
  int j;
  ZZ sumInvRj;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffd08;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_stack_fffffffffffffd10;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  *in_stack_fffffffffffffd18;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffd20;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffd28;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffd30;
  value_type __x_00;
  size_type in_stack_fffffffffffffd38;
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  *in_stack_fffffffffffffd40;
  Z *in_stack_fffffffffffffd50;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffd58;
  X *in_stack_fffffffffffffe78;
  LinearExpert<1,_1> *in_stack_fffffffffffffe80;
  undefined4 local_14c;
  undefined4 local_1c;
  
  Eigen::Matrix<double,_1,_1,_0,_1,_1>::Matrix
            ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffd10,
             (Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffd08);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffd20
             ,(Index)in_stack_fffffffffffffd18,(Index)in_stack_fffffffffffffd10);
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::clear((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           *)0x283bf2);
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::clear((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           *)0x283c03);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x283c14);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd10,
             (Index)in_stack_fffffffffffffd08);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     (in_stack_fffffffffffffd10,(Index)in_stack_fffffffffffffd08);
  *pSVar1 = 0.0;
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::clear((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           *)0x283c57);
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::reserve(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffd30
             ,(Index)in_stack_fffffffffffffd28,(Index)in_stack_fffffffffffffd20);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd10,
             (Index)in_stack_fffffffffffffd08);
  for (local_1c = 0; local_1c < *(int *)(in_RDI + 0xb0); local_1c = local_1c + 1) {
    std::
    vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>::
    operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                *)(in_RDI + 0x98),(long)local_1c);
    SVar3 = LinearExpert<1,_1>::queryX(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    in_stack_fffffffffffffd40 =
         (vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
          *)(in_RDI + 0x278);
    pFVar2 = std::
             vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                           *)(in_RDI + 0x98),(long)local_1c);
    LinearExpert<1,_1>::getPredZInvVar(&pFVar2->super_LinearExpert<1,_1>);
    Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator*
              (in_stack_fffffffffffffd58,(double *)in_stack_fffffffffffffd50);
    Eigen::Matrix<double,1,1,0,1,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,1,0,1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const>>
              ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffd10,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
                *)in_stack_fffffffffffffd08);
    std::
    vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ::push_back((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 *)in_stack_fffffffffffffd20,(value_type *)in_stack_fffffffffffffd18);
    std::
    vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ::operator[]((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                  *)(in_RDI + 0x278),(long)local_1c);
    pFVar2 = std::
             vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                           *)(in_RDI + 0x98),(long)local_1c);
    LinearExpert<1,_1>::getPredZ(&pFVar2->super_LinearExpert<1,_1>);
    Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator*
              ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffffd10,
               in_stack_fffffffffffffd08);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (in_stack_fffffffffffffd20,(Index)in_stack_fffffffffffffd18);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
               in_stack_fffffffffffffd10,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_0>_>
                *)in_stack_fffffffffffffd08);
    pFVar2 = std::
             vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                           *)(in_RDI + 0x98),(long)local_1c);
    in_stack_fffffffffffffd50 = LinearExpert<1,_1>::getPredZ(&pFVar2->super_LinearExpert<1,_1>);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (in_stack_fffffffffffffd20,(Index)in_stack_fffffffffffffd18);
    in_stack_fffffffffffffd58 =
         (MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
         Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::
         dot<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
                   ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffffd10,
                    (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                     *)in_stack_fffffffffffffd08);
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (in_stack_fffffffffffffd10,(Index)in_stack_fffffffffffffd08);
    *pSVar1 = (Scalar)in_stack_fffffffffffffd58;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (in_stack_fffffffffffffd10,(Index)in_stack_fffffffffffffd08);
    *pSVar1 = SVar3 + *pSVar1;
    std::
    vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ::operator[]((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                  *)(in_RDI + 0x278),(long)local_1c);
    Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator+=
              (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (in_stack_fffffffffffffd20,(Index)in_stack_fffffffffffffd18);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (in_stack_fffffffffffffd20,(Index)in_stack_fffffffffffffd18);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::operator+=
              ((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
               in_stack_fffffffffffffd30,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
               in_stack_fffffffffffffd28);
  }
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     (in_stack_fffffffffffffd10,(Index)in_stack_fffffffffffffd08);
  __x_00 = (value_type)((ulong)in_stack_fffffffffffffd30 >> 0x20);
  *(double *)(in_RDI + 0x188) = *pSVar1 + *(double *)(in_RDI + 0xe0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     (in_stack_fffffffffffffd10,(Index)in_stack_fffffffffffffd08);
  if ((*pSVar1 != 0.0) || (NAN(*pSVar1))) {
    if ((*(double *)(in_RDI + 0x60) != 0.0) || (NAN(*(double *)(in_RDI + 0x60)))) {
      Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::inverse(in_stack_fffffffffffffd08);
      Eigen::Matrix<double,1,1,0,1,1>::Matrix<Eigen::Inverse<Eigen::Matrix<double,1,1,0,1,1>>>
                ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffd10,
                 (EigenBase<Eigen::Inverse<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_> *)
                 in_stack_fffffffffffffd08);
      other = (EigenBase<Eigen::Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>_>
               *)(in_RDI + 0x2e0);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffffd20,(Index)in_stack_fffffffffffffd18);
      Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator*
                ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffffd20,
                 in_stack_fffffffffffffd18);
      Eigen::Matrix<double,1,1,0,1,1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,1,1,0,1,1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,0>>
                ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffd10,other);
      std::
      vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ::push_back((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                   *)in_stack_fffffffffffffd20,(value_type *)in_stack_fffffffffffffd18);
      this_01 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)(in_RDI + 0x2f8);
      Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator*
                (in_stack_fffffffffffffd58,(double *)in_stack_fffffffffffffd50);
      Eigen::Matrix<double,1,1,0,1,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,1,0,1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const>>
                ((Matrix<double,_1,_1,_0,_1,_1> *)this_01,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
                  *)other);
      std::
      vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ::push_back((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                   *)in_stack_fffffffffffffd20,(value_type *)in_stack_fffffffffffffd18);
      __x = (value_type_conflict *)(in_RDI + 0x310);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                (this_01,(Index)other);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd20,__x);
      *(undefined4 *)(in_RDI + 0x328) = 1;
      std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x284397);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd40,
                 in_stack_fffffffffffffd38,__x_00);
    }
    else {
      std::
      vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ::reserve(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      std::
      vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ::reserve(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      std::vector<double,_std::allocator<double>_>::reserve
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd40,
                 in_stack_fffffffffffffd38);
      for (local_14c = 0; local_14c < *(int *)(in_RDI + 0xb0); local_14c = local_14c + 1) {
        this_00 = (vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                   *)(in_RDI + 0x2e0);
        pFVar2 = std::
                 vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                 ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                               *)(in_RDI + 0x98),(long)local_14c);
        LinearExpert<1,_1>::getPredZ(&pFVar2->super_LinearExpert<1,_1>);
        std::
        vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ::push_back(this_00,(value_type *)in_stack_fffffffffffffd18);
        pFVar2 = std::
                 vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                 ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                               *)(in_RDI + 0x98),(long)local_14c);
        LinearExpert<1,_1>::getPredZVar(&pFVar2->super_LinearExpert<1,_1>);
        pFVar2 = std::
                 vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                 ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                               *)(in_RDI + 0x98),(long)local_14c);
        LinearExpert<1,_1>::get_p_x(&pFVar2->super_LinearExpert<1,_1>);
        Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator*
                  (in_stack_fffffffffffffd58,(double *)in_stack_fffffffffffffd50);
        pFVar2 = std::
                 vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                 ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                               *)(in_RDI + 0x98),(long)local_14c);
        LinearExpert<1,_1>::get_p_x(&pFVar2->super_LinearExpert<1,_1>);
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,1,0,1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const>>
        ::operator/((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
                     *)in_stack_fffffffffffffd58,(double *)in_stack_fffffffffffffd50);
        Eigen::Matrix<double,1,1,0,1,1>::
        Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,1,0,1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const>>
                  ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffd10,
                   (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
                    *)in_stack_fffffffffffffd08);
        std::
        vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ::push_back(this_00,(value_type *)in_stack_fffffffffffffd18);
        pFVar2 = std::
                 vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                 ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                               *)(in_RDI + 0x98),(long)local_14c);
        LinearExpert<1,_1>::get_p_x(&pFVar2->super_LinearExpert<1,_1>);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)this_00,
                   (value_type_conflict *)in_stack_fffffffffffffd18);
      }
      *(undefined4 *)(in_RDI + 0x328) = *(undefined4 *)(in_RDI + 0xb0);
    }
  }
  else {
    std::
    vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ::push_back((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 *)in_stack_fffffffffffffd20,(value_type *)in_stack_fffffffffffffd18);
    std::
    vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ::push_back((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 *)in_stack_fffffffffffffd20,(value_type *)in_stack_fffffffffffffd18);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd20,
               (value_type_conflict *)in_stack_fffffffffffffd18);
    *(undefined4 *)(in_RDI + 0x328) = 1;
  }
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::predictInverseSingle(X const &x)
{
    // Aux variables
    ZZ sumInvRj = zeroZZ;
    sumInvRzj.setZero(d,1);

    // Clear predict data structure
    invPredictions.clear();
    invPredictionsVar.clear();
    invPredictionsWeight.clear();

    sum_p_x.resize(1);
    sum_p_x(0) = 0.0;
    iInvRj.clear(); iInvRj.reserve(M);
    invRzj.resize(d,M);
    zInvRzj.resize(M);

#ifdef IMLE_NO_TEMPLATES
    // Check dimensions
    if( x.size() != D )
    {
        message("IMLE::predict: query dimension does not match output dimension!!");

        sum_p_x.setZero(1);
    }
    else
#endif
        for(int j = 0; j < M; j++)
        {
            Scal p_x = experts[j].queryX(x);

            // These are needed for multivalued inverse prediction
            iInvRj.push_back(experts[j].getPredZInvVar() * p_x );
            invRzj.col(j) = iInvRj[j] * experts[j].getPredZ();
            zInvRzj(j) = experts[j].getPredZ().dot( invRzj.col(j) );

            sum_p_x(0) += p_x;
            sumInvRj += iInvRj[j];
            sumInvRzj.col(0) += invRzj.col(j);
        }
    sumAll = sum_p_x(0) + pNoiseModelX;

    if(sum_p_x(0) == 0.0)  // This happens when a prediction is sought too far from the current mixture
    {
        invPredictions.push_back(zeroZ);
        invPredictionsVar.push_back( infinityZZ );
        invPredictionsWeight.push_back(0.0);

        nInvSolFound = 1;
        return;
    }
    else if( param.multiValuedSignificance == 0.0 )
    {
        invPredictions.reserve(M);
        invPredictionsVar.reserve(M);
        invPredictionsWeight.reserve(M);

        for(int j = 0; j < M; j++)
        {
            invPredictions.push_back( experts[j].getPredZ() );
            invPredictionsVar.push_back( experts[j].getPredZVar() *(experts[j].get_p_x() + pNoiseModelX) / experts[j].get_p_x() );
            invPredictionsWeight.push_back(experts[j].get_p_x() / sumAll);
        }

        nInvSolFound = M;
        return;
    }
    else
    {
        ZZ invVar = sumInvRj.inverse();

        invPredictions.push_back( invVar * sumInvRzj.col(0) );
        invPredictionsVar.push_back( invVar * sumAll );
        invPredictionsWeight.push_back(sum_p_x(0) / sumAll );
    }

    nInvSolFound = 1;
    sNearestInv.clear();
    sNearestInv.resize(M,0);
}